

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void __thiscall
dmlc::JSONWriter::
WriteObjectKeyValue<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (JSONWriter *this,string *key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *value)

{
  ostream *os;
  reference pvVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *value_local;
  string *key_local;
  JSONWriter *this_local;
  
  local_20 = value;
  value_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)key;
  key_local = (string *)this;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->scope_counter_);
  if (*pvVar1 != 0) {
    (anonymous_namespace)::Extend<char_const*>(this->os_,", ");
  }
  WriteSeperator(this);
  anon_unknown_9::Extend<char>(this->os_,'\"');
  os = this->os_;
  std::__cxx11::string::string((string *)&local_40,(string *)value_local);
  (anonymous_namespace)::Extend<std::__cxx11::string>(os,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (anonymous_namespace)::Extend<char_const*>(this->os_,"\": ");
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->scope_counter_);
  *pvVar1 = *pvVar1 + 1;
  json::
  ArrayHandler<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::Write(this,local_20);
  return;
}

Assistant:

inline void JSONWriter::WriteObjectKeyValue(const std::string &key,
                                            const ValueType &value) {
  if (scope_counter_.back() > 0) {
    Extend(os_, ", ");
  }
  WriteSeperator();
  Extend(os_, '\"');
  Extend(os_, key);
  Extend(os_, "\": ");
  scope_counter_.back() += 1;
  json::Handler<ValueType>::Write(this, value);
}